

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg>::DoDelete
          (TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg> *this,uint first,uint last)

{
  PortalDrawseg *pPVar1;
  int iVar2;
  long lVar3;
  
  if (last != 0xffffffff) {
    if (first <= last) {
      lVar3 = (ulong)first * 0x48 + 0x20;
      iVar2 = (last - first) + 1;
      do {
        pPVar1 = this->Array;
        TArray<short,_short>::~TArray((TArray<short,_short> *)((long)&pPVar1->x1 + lVar3));
        TArray<short,_short>::~TArray((TArray<short,_short> *)((long)&pPVar1->src + lVar3));
        lVar3 = lVar3 + 0x48;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x1ad,
                "void TArray<swrenderer::PortalDrawseg>::DoDelete(unsigned int, unsigned int) [T = swrenderer::PortalDrawseg, TT = swrenderer::PortalDrawseg]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}